

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O0

Id __thiscall spv::Builder::makeAccelerationStructureType(Builder *this)

{
  Id IVar1;
  mapped_type *pmVar2;
  size_type sVar3;
  Instruction *this_00;
  mapped_type_conflict *pmVar4;
  reference ppIVar5;
  key_type local_50;
  Id local_4c;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_48;
  Id local_2c;
  Id debugType;
  key_type local_20 [2];
  Instruction *local_18;
  Instruction *type;
  Builder *this_local;
  
  local_20[1] = 0x14dd;
  type = (Instruction *)this;
  pmVar2 = std::
           unordered_map<unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>_>_>
           ::operator[](&this->groupedTypes,local_20 + 1);
  sVar3 = std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>::size(pmVar2);
  if (sVar3 == 0) {
    this_00 = (Instruction *)::operator_new(0x60);
    IVar1 = getUniqueId(this);
    spv::Instruction::Instruction(this_00,IVar1,0,OpTypeAccelerationStructureKHR);
    local_20[0] = 0x14dd;
    local_18 = this_00;
    pmVar2 = std::
             unordered_map<unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>_>_>
             ::operator[](&this->groupedTypes,local_20);
    std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>::push_back
              (pmVar2,&local_18);
    std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>::
    unique_ptr<std::default_delete<spv::Instruction>,void>
              ((unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>> *)
               &stack0xffffffffffffffd8,local_18);
    std::
    vector<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_std::allocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
    ::push_back(&this->constantsTypesGlobals,(value_type *)&stack0xffffffffffffffd8);
    std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr
              ((unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)
               &stack0xffffffffffffffd8);
    Module::mapInstruction(&this->module,local_18);
    if ((this->emitNonSemanticShaderDebugInfo & 1U) != 0) {
      memset(&local_48,0,0x18);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_48);
      IVar1 = makeCompositeDebugType
                        (this,&local_48,"accelerationStructure",
                         NonSemanticShaderDebugInfo100Structure,true);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_48);
      local_2c = IVar1;
      local_4c = spv::Instruction::getResultId(local_18);
      pmVar4 = std::
               map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
               ::operator[](&this->debugId,&local_4c);
      *pmVar4 = IVar1;
    }
  }
  else {
    local_50 = 0x14dd;
    pmVar2 = std::
             unordered_map<unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>_>_>
             ::operator[](&this->groupedTypes,&local_50);
    ppIVar5 = std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>::back(pmVar2);
    local_18 = *ppIVar5;
  }
  IVar1 = spv::Instruction::getResultId(local_18);
  return IVar1;
}

Assistant:

Id Builder::makeAccelerationStructureType()
{
    Instruction *type;
    if (groupedTypes[OpTypeAccelerationStructureKHR].size() == 0) {
        type = new Instruction(getUniqueId(), NoType, OpTypeAccelerationStructureKHR);
        groupedTypes[OpTypeAccelerationStructureKHR].push_back(type);
        constantsTypesGlobals.push_back(std::unique_ptr<Instruction>(type));
        module.mapInstruction(type);
        if (emitNonSemanticShaderDebugInfo) {
            spv::Id debugType = makeCompositeDebugType({}, "accelerationStructure", NonSemanticShaderDebugInfo100Structure, true);
            debugId[type->getResultId()] = debugType;
        }
    } else {
        type = groupedTypes[OpTypeAccelerationStructureKHR].back();
    }

    return type->getResultId();
}